

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int cert_stuff(Curl_easy *data,SSL_CTX *ctx,char *cert_file,curl_blob *cert_blob,char *cert_type,
              char *key_file,curl_blob *key_blob,char *key_type,char *key_passwd)

{
  ENGINE *e;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  uint uVar6;
  BIO *pBVar7;
  X509 *pXVar8;
  X509 *pXVar9;
  long lVar10;
  BIO_METHOD *type;
  PKCS12 *p12;
  ulong uVar11;
  EVP_PKEY *pEVar12;
  UI_METHOD *method;
  UI_METHOD *pUVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSL *ssl;
  evp_pkey_st *peVar14;
  rsa_st *r;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  bool bVar15;
  char *pcVar16;
  char *pcVar17;
  X509 *x509;
  EVP_PKEY *pri;
  char error_buffer [256];
  stack_st_X509 *local_170;
  X509 *local_168;
  X509 *local_160;
  int local_154;
  EVP_PKEY *local_150;
  BIO *local_148;
  char *local_140;
  char local_138 [264];
  
  local_140 = key_file;
  iVar2 = do_file_type(cert_type);
  if (iVar2 != 0x2a && (cert_file == (char *)0x0 && cert_blob == (curl_blob *)0x0)) {
    return 1;
  }
  if (key_passwd != (char *)0x0) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)ctx,key_passwd);
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)ctx,passwd_callback);
  }
  if (iVar2 < 0x2a) {
    if (iVar2 == 1) {
      if (cert_blob == (curl_blob *)0x0) {
        iVar3 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)ctx,cert_file);
      }
      else {
        pBVar7 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
        if (pBVar7 == (BIO *)0x0) {
          iVar3 = 0x1b;
        }
        else {
          ERR_clear_error();
          pXVar9 = PEM_read_bio_X509_AUX(pBVar7,(X509 **)0x0,passwd_callback,key_passwd);
          iVar3 = 0;
          if (pXVar9 != (X509 *)0x0) {
            iVar4 = SSL_CTX_use_certificate((SSL_CTX *)ctx,pXVar9);
            local_148 = pBVar7;
            uVar11 = ERR_peek_error();
            pBVar7 = local_148;
            if (uVar11 != 0) {
              iVar4 = 0;
            }
            iVar3 = 0;
            local_154 = iVar4;
            if (iVar4 != 0) {
              lVar10 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x58,0,(void *)0x0);
              iVar3 = 0;
              if (lVar10 != 0) {
                do {
                  pXVar8 = PEM_read_bio_X509(pBVar7,(X509 **)0x0,passwd_callback,key_passwd);
                  if (pXVar8 == (X509 *)0x0) {
                    uVar11 = ERR_peek_last_error();
                    iVar3 = 0;
                    if ((int)uVar11 == 0x480006c) {
                      ERR_clear_error();
                      iVar3 = local_154;
                    }
                    goto LAB_006190f0;
                  }
                  lVar10 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x59,0,pXVar8);
                } while (lVar10 != 0);
                X509_free(pXVar8);
                iVar3 = 0;
              }
            }
          }
LAB_006190f0:
          X509_free(pXVar9);
          BIO_free(pBVar7);
        }
      }
      if (iVar3 != 1) {
        if (cert_blob != (curl_blob *)0x0) {
          cert_file = "CURLOPT_SSLCERT_BLOB";
        }
        uVar11 = ERR_get_error();
        ossl_strerror(uVar11,local_138,size_06);
        pcVar16 = 
        "could not load PEM client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
        ;
        goto LAB_0061913c;
      }
LAB_0061910a:
      bVar1 = 0;
LAB_006191a8:
      pcVar16 = local_140;
      pcVar17 = cert_file;
      if (local_140 != (char *)0x0 || key_blob != (curl_blob *)0x0) {
        iVar2 = do_file_type(key_type);
        cert_blob = key_blob;
        pcVar17 = pcVar16;
      }
      if (0x29 < iVar2) {
        if (iVar2 == 0x2a) {
          if (((pcVar17 != (char *)0x0) && ((data->state).engine == (void *)0x0)) &&
             (iVar2 = Curl_strncasecompare(pcVar17,"pkcs11:",7), iVar2 != 0)) {
            CVar5 = ossl_set_engine(data,"pkcs11");
            iVar3 = 1;
            if (CVar5 != CURLE_OK) goto LAB_0061951a;
          }
          if ((data->state).engine == (void *)0x0) {
            pcVar16 = "crypto engine not set, can\'t load private key";
          }
          else {
            method = UI_create_method("curl user interface");
            if (method == (UI_METHOD *)0x0) {
              pcVar16 = "unable do create OpenSSL user-interface method";
            }
            else {
              pUVar13 = UI_OpenSSL();
              iVar2 = UI_method_get_opener((UI *)pUVar13);
              UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar2));
              pUVar13 = UI_OpenSSL();
              iVar2 = UI_method_get_closer((UI *)pUVar13);
              UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar2));
              UI_method_set_reader(method,ssl_ui_reader);
              UI_method_set_writer(method,ssl_ui_writer);
              pEVar12 = ENGINE_load_private_key
                                  ((ENGINE *)(data->state).engine,pcVar17,method,key_passwd);
              UI_destroy_method(method);
              if (pEVar12 != (EVP_PKEY *)0x0) {
                iVar2 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar12);
                if (iVar2 != 1) {
                  Curl_failf(data,"unable to set private key");
                  EVP_PKEY_free(pEVar12);
                  goto LAB_00619514;
                }
                EVP_PKEY_free(pEVar12);
                goto LAB_0061940c;
              }
              pcVar16 = "failed to load private key from crypto engine";
            }
          }
        }
        else {
          if (iVar2 != 0x2b) goto LAB_00619219;
          if (bVar1 != 0) goto LAB_0061940c;
          pcVar16 = "file type P12 for private key not supported";
        }
        goto LAB_0061950d;
      }
      if (iVar2 == 1) {
        if (bVar1 == 0) goto LAB_0061922e;
      }
      else {
        if (iVar2 != 2) {
LAB_00619219:
          pcVar16 = "not supported file type for private key";
          goto LAB_0061950d;
        }
LAB_0061922e:
        if (cert_blob == (curl_blob *)0x0) {
          iVar3 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)ctx,pcVar17,iVar2);
        }
        else {
          pBVar7 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
          if (pBVar7 == (BIO *)0x0) {
            iVar3 = 0x1b;
          }
          else {
            if (iVar2 == 2) {
              pEVar12 = d2i_PrivateKey_bio(pBVar7,(EVP_PKEY **)0x0);
LAB_006193d7:
              iVar3 = 0;
              if (pEVar12 != (EVP_PKEY *)0x0) {
                iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar12);
                EVP_PKEY_free(pEVar12);
              }
            }
            else {
              iVar3 = 0;
              if (iVar2 == 1) {
                pEVar12 = PEM_read_bio_PrivateKey
                                    (pBVar7,(EVP_PKEY **)0x0,passwd_callback,key_passwd);
                goto LAB_006193d7;
              }
            }
            BIO_free(pBVar7);
          }
        }
        if (iVar3 != 1) {
          cert_file = "(memory blob)";
          if (pcVar17 != (char *)0x0) {
            cert_file = pcVar17;
          }
          pcVar17 = "PEM";
          if (key_type != (char *)0x0) {
            pcVar17 = key_type;
          }
          pcVar16 = "unable to set private key file: \'%s\' type %s";
          goto LAB_00619145;
        }
      }
LAB_0061940c:
      ssl = SSL_new((SSL_CTX *)ctx);
      if (ssl == (SSL *)0x0) {
        pcVar16 = "unable to create an SSL structure";
        goto LAB_0061950d;
      }
      local_168 = SSL_get_certificate(ssl);
      if (local_168 != (X509 *)0x0) {
        pEVar12 = X509_get_pubkey(local_168);
        peVar14 = SSL_get_privatekey(ssl);
        EVP_PKEY_copy_parameters(pEVar12,peVar14);
        EVP_PKEY_free(pEVar12);
      }
      peVar14 = SSL_get_privatekey(ssl);
      iVar2 = EVP_PKEY_get_id(peVar14);
      if (iVar2 == 6) {
        r = EVP_PKEY_get1_RSA(peVar14);
        uVar6 = RSA_flags(r);
        RSA_free(r);
        SSL_free(ssl);
        if ((uVar6 & 1) == 0) goto LAB_006194e6;
      }
      else {
        SSL_free(ssl);
LAB_006194e6:
        iVar2 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
        if (iVar2 == 0) {
          pcVar16 = "Private key does not match the certificate public key";
          goto LAB_0061950d;
        }
      }
      iVar3 = 0;
      goto LAB_0061951a;
    }
    if (iVar2 == 2) {
      if (cert_blob == (curl_blob *)0x0) {
        iVar3 = SSL_CTX_use_certificate_file((SSL_CTX *)ctx,cert_file,2);
      }
      else {
        pBVar7 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
        if (pBVar7 == (BIO *)0x0) {
          iVar3 = 0x1b;
        }
        else {
          iVar3 = 0;
          pXVar8 = d2i_X509_bio(pBVar7,(X509 **)0x0);
          pXVar9 = (X509 *)0x0;
          if (pXVar8 != (X509 *)0x0) {
            iVar3 = SSL_CTX_use_certificate((SSL_CTX *)ctx,pXVar8);
            pXVar9 = pXVar8;
          }
          X509_free(pXVar9);
          BIO_free(pBVar7);
        }
      }
      if (iVar3 == 1) goto LAB_0061910a;
      if (cert_blob != (curl_blob *)0x0) {
        cert_file = "CURLOPT_SSLCERT_BLOB";
      }
      uVar11 = ERR_get_error();
      ossl_strerror(uVar11,local_138,size_00);
      pcVar16 = 
      "could not load ASN1 client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
      ;
LAB_0061913c:
      pcVar17 = local_138;
LAB_00619145:
      Curl_failf(data,pcVar16,cert_file,pcVar17);
    }
    else {
LAB_00618b8a:
      pcVar16 = "not supported file type \'%s\' for certificate";
LAB_00618b91:
      Curl_failf(data,pcVar16,cert_type);
    }
  }
  else {
    if (iVar2 != 0x2a) {
      if (iVar2 != 0x2b) goto LAB_00618b8a;
      local_170 = (stack_st_X509 *)0x0;
      if (cert_blob == (curl_blob *)0x0) {
        type = BIO_s_file();
        pBVar7 = BIO_new(type);
        if (pBVar7 == (BIO *)0x0) {
          uVar11 = ERR_get_error();
          ossl_strerror(uVar11,local_138,size_01);
          pcVar16 = "BIO_new return NULL, OpenSSL error %s";
          goto LAB_00618fd8;
        }
        lVar10 = BIO_ctrl(pBVar7,0x6c,3,cert_file);
        if (0 < (int)lVar10) goto LAB_00618de4;
        Curl_failf(data,"could not open PKCS12 file \'%s\'",cert_file);
        BIO_free(pBVar7);
LAB_00618fe2:
        bVar1 = 0;
        iVar3 = 1;
      }
      else {
        pBVar7 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
        if (pBVar7 == (BIO *)0x0) {
          uVar11 = ERR_get_error();
          ossl_strerror(uVar11,local_138,size);
          pcVar16 = "BIO_new_mem_buf NULL, OpenSSL error %s";
LAB_00618fd8:
          pcVar17 = local_138;
LAB_00618fdb:
          Curl_failf(data,pcVar16,pcVar17);
          goto LAB_00618fe2;
        }
LAB_00618de4:
        p12 = d2i_PKCS12_bio(pBVar7,(PKCS12 **)0x0);
        BIO_free(pBVar7);
        if (p12 == (PKCS12 *)0x0) {
          pcVar17 = "(memory blob)";
          if (cert_blob == (curl_blob *)0x0) {
            pcVar17 = cert_file;
          }
          pcVar16 = "error reading PKCS12 file \'%s\'";
          goto LAB_00618fdb;
        }
        PKCS12_PBE_add();
        iVar3 = PKCS12_parse(p12,key_passwd,&local_150,&local_168,&local_170);
        if (iVar3 == 0) {
          uVar11 = ERR_get_error();
          ossl_strerror(uVar11,local_138,size_02);
          Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",local_138)
          ;
          PKCS12_free(p12);
          goto LAB_00618fe2;
        }
        PKCS12_free(p12);
        iVar3 = SSL_CTX_use_certificate((SSL_CTX *)ctx,local_168);
        if (iVar3 == 1) {
          iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,local_150);
          pcVar16 = cert_file;
          if (iVar3 != 1) {
            pcVar17 = "unable to use private key from PKCS12 file \'%s\'";
            goto LAB_0061915e;
          }
          iVar3 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
          if (iVar3 == 0) {
            pcVar17 = "private key from PKCS12 file \'%s\' does not match certificate in same file";
            goto LAB_0061915e;
          }
          if (local_170 == (stack_st_X509 *)0x0) {
            bVar15 = false;
            goto LAB_00619167;
          }
          do {
            iVar3 = OPENSSL_sk_num(local_170);
            bVar15 = iVar3 != 0;
            if (iVar3 == 0) goto LAB_00619167;
            pXVar9 = (X509 *)OPENSSL_sk_pop(local_170);
            iVar3 = SSL_CTX_add_client_CA((SSL_CTX *)ctx,pXVar9);
            pcVar16 = "cannot add certificate to client CA list";
            if (iVar3 == 0) {
LAB_00618eeb:
              X509_free(pXVar9);
              Curl_failf(data,pcVar16);
              iVar3 = 3;
            }
            else {
              iVar3 = 0;
              lVar10 = SSL_CTX_ctrl((SSL_CTX *)ctx,0xe,0,pXVar9);
              pcVar16 = "cannot add certificate to certificate chain";
              if (lVar10 == 0) goto LAB_00618eeb;
            }
          } while (iVar3 == 0);
          if (iVar3 == 3) goto LAB_00619167;
          bVar1 = 0;
        }
        else {
          uVar11 = ERR_get_error();
          ossl_strerror(uVar11,local_138,size_04);
          pcVar17 = "could not load PKCS12 client certificate, OpenSSL error %s";
          pcVar16 = local_138;
LAB_0061915e:
          Curl_failf(data,pcVar17,pcVar16);
          bVar15 = true;
LAB_00619167:
          EVP_PKEY_free(local_150);
          X509_free(local_168);
          OPENSSL_sk_pop_free(local_170,X509_free);
          iVar3 = 2 - (uint)bVar15;
          bVar1 = bVar15 ^ 1;
        }
      }
      if (iVar3 != 2) goto LAB_0061951a;
      goto LAB_006191a8;
    }
    if (((cert_file != (char *)0x0) && ((data->state).engine == (void *)0x0)) &&
       (iVar3 = Curl_strncasecompare(cert_file,"pkcs11:",7), iVar3 != 0)) {
      CVar5 = ossl_set_engine(data,"pkcs11");
      iVar3 = 1;
      if (CVar5 != CURLE_OK) goto LAB_0061951a;
    }
    e = (ENGINE *)(data->state).engine;
    if (e == (ENGINE *)0x0) {
      pcVar16 = "crypto engine not set, can\'t load certificate";
    }
    else {
      local_160 = (X509 *)0x0;
      local_168 = (X509 *)cert_file;
      iVar3 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
      if (iVar3 == 0) {
        pcVar16 = "ssl engine does not support loading certificates";
      }
      else {
        iVar3 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&local_168,
                                (f *)0x0,1);
        if (iVar3 == 0) {
          uVar11 = ERR_get_error();
          ossl_strerror(uVar11,local_138,size_03);
          pcVar16 = "ssl engine cannot load client cert with id \'%s\' [%s]";
          goto LAB_0061913c;
        }
        if (local_160 != (X509 *)0x0) {
          iVar3 = SSL_CTX_use_certificate((SSL_CTX *)ctx,local_160);
          if (iVar3 == 1) {
            X509_free(local_160);
            goto LAB_0061910a;
          }
          uVar11 = ERR_get_error();
          cert_type = local_138;
          ossl_strerror(uVar11,cert_type,size_05);
          pcVar16 = "unable to set client certificate [%s]";
          goto LAB_00618b91;
        }
        pcVar16 = "ssl engine didn\'t initialized the certificate properly.";
      }
    }
LAB_0061950d:
    Curl_failf(data,pcVar16);
  }
LAB_00619514:
  iVar3 = 1;
LAB_0061951a:
  if (iVar3 == 0) {
    return 1;
  }
  return 0;
}

Assistant:

static
int cert_stuff(struct Curl_easy *data,
               SSL_CTX* ctx,
               char *cert_file,
               const struct curl_blob *cert_blob,
               const char *cert_type,
               char *key_file,
               const struct curl_blob *key_blob,
               const char *key_type,
               char *key_passwd)
{
  char error_buffer[256];
  bool check_privkey = TRUE;

  int file_type = do_file_type(cert_type);

  if(cert_file || cert_blob || (file_type == SSL_FILETYPE_ENGINE)) {
    SSL *ssl;
    X509 *x509;
    int cert_done = 0;
    int cert_use_result;

    if(key_passwd) {
      /* set the password in the callback userdata */
      SSL_CTX_set_default_passwd_cb_userdata(ctx, key_passwd);
      /* Set passwd callback: */
      SSL_CTX_set_default_passwd_cb(ctx, passwd_callback);
    }


    switch(file_type) {
    case SSL_FILETYPE_PEM:
      /* SSL_CTX_use_certificate_chain_file() only works on PEM files */
      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_chain_blob(ctx, cert_blob, key_passwd) :
        SSL_CTX_use_certificate_chain_file(ctx, cert_file);
      if(cert_use_result != 1) {
        failf(data,
              "could not load PEM client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;

    case SSL_FILETYPE_ASN1:
      /* SSL_CTX_use_certificate_file() works with either PEM or ASN1, but
         we use the case above for PEM so this can only be performed with
         ASN1 files. */

      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_blob(ctx, cert_blob,
                                     file_type, key_passwd) :
        SSL_CTX_use_certificate_file(ctx, cert_file, file_type);
      if(cert_use_result != 1) {
        failf(data,
              "could not load ASN1 client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#if defined(USE_OPENSSL_ENGINE) && defined(ENGINE_CTRL_GET_CMD_FROM_NAME)
      {
        /* Implicitly use pkcs11 engine if none was provided and the
         * cert_file is a PKCS#11 URI */
        if(!data->state.engine) {
          if(is_pkcs11_uri(cert_file)) {
            if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
              return 0;
            }
          }
        }

        if(data->state.engine) {
          const char *cmd_name = "LOAD_CERT_CTRL";
          struct {
            const char *cert_id;
            X509 *cert;
          } params;

          params.cert_id = cert_file;
          params.cert = NULL;

          /* Does the engine supports LOAD_CERT_CTRL ? */
          if(!ENGINE_ctrl(data->state.engine, ENGINE_CTRL_GET_CMD_FROM_NAME,
                          0, (void *)cmd_name, NULL)) {
            failf(data, "ssl engine does not support loading certificates");
            return 0;
          }

          /* Load the certificate from the engine */
          if(!ENGINE_ctrl_cmd(data->state.engine, cmd_name,
                              0, &params, NULL, 1)) {
            failf(data, "ssl engine cannot load client cert with id"
                  " '%s' [%s]", cert_file,
                  ossl_strerror(ERR_get_error(), error_buffer,
                                sizeof(error_buffer)));
            return 0;
          }

          if(!params.cert) {
            failf(data, "ssl engine didn't initialized the certificate "
                  "properly.");
            return 0;
          }

          if(SSL_CTX_use_certificate(ctx, params.cert) != 1) {
            failf(data, "unable to set client certificate [%s]",
                  ossl_strerror(ERR_get_error(), error_buffer,
                                sizeof(error_buffer)));
            return 0;
          }
          X509_free(params.cert); /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load certificate");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for certificate not implemented");
      return 0;
#endif

    case SSL_FILETYPE_PKCS12:
    {
      BIO *cert_bio = NULL;
      PKCS12 *p12 = NULL;
      EVP_PKEY *pri;
      STACK_OF(X509) *ca = NULL;
      if(cert_blob) {
        cert_bio = BIO_new_mem_buf(cert_blob->data, (int)(cert_blob->len));
        if(!cert_bio) {
          failf(data,
                "BIO_new_mem_buf NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }
      }
      else {
        cert_bio = BIO_new(BIO_s_file());
        if(!cert_bio) {
          failf(data,
                "BIO_new return NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }

        if(BIO_read_filename(cert_bio, cert_file) <= 0) {
          failf(data, "could not open PKCS12 file '%s'", cert_file);
          BIO_free(cert_bio);
          return 0;
        }
      }

      p12 = d2i_PKCS12_bio(cert_bio, NULL);
      BIO_free(cert_bio);

      if(!p12) {
        failf(data, "error reading PKCS12 file '%s'",
              cert_blob ? "(memory blob)" : cert_file);
        return 0;
      }

      PKCS12_PBE_add();

      if(!PKCS12_parse(p12, key_passwd, &pri, &x509,
                       &ca)) {
        failf(data,
              "could not parse PKCS12 file, check password, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        PKCS12_free(p12);
        return 0;
      }

      PKCS12_free(p12);

      if(SSL_CTX_use_certificate(ctx, x509) != 1) {
        failf(data,
              "could not load PKCS12 client certificate, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        goto fail;
      }

      if(SSL_CTX_use_PrivateKey(ctx, pri) != 1) {
        failf(data, "unable to use private key from PKCS12 file '%s'",
              cert_file);
        goto fail;
      }

      if(!SSL_CTX_check_private_key (ctx)) {
        failf(data, "private key from PKCS12 file '%s' "
              "does not match certificate in same file", cert_file);
        goto fail;
      }
      /* Set Certificate Verification chain */
      if(ca) {
        while(sk_X509_num(ca)) {
          /*
           * Note that sk_X509_pop() is used below to make sure the cert is
           * removed from the stack properly before getting passed to
           * SSL_CTX_add_extra_chain_cert(), which takes ownership. Previously
           * we used sk_X509_value() instead, but then we'd clean it in the
           * subsequent sk_X509_pop_free() call.
           */
          X509 *x = sk_X509_pop(ca);
          if(!SSL_CTX_add_client_CA(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to client CA list");
            goto fail;
          }
          if(!SSL_CTX_add_extra_chain_cert(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to certificate chain");
            goto fail;
          }
        }
      }

      cert_done = 1;
  fail:
      EVP_PKEY_free(pri);
      X509_free(x509);
      sk_X509_pop_free(ca, X509_free);
      if(!cert_done)
        return 0; /* failure! */
      break;
    }
    default:
      failf(data, "not supported file type '%s' for certificate", cert_type);
      return 0;
    }

    if((!key_file) && (!key_blob)) {
      key_file = cert_file;
      key_blob = cert_blob;
    }
    else
      file_type = do_file_type(key_type);

    switch(file_type) {
    case SSL_FILETYPE_PEM:
      if(cert_done)
        break;
      /* FALLTHROUGH */
    case SSL_FILETYPE_ASN1:
      cert_use_result = key_blob ?
        SSL_CTX_use_PrivateKey_blob(ctx, key_blob, file_type, key_passwd) :
        SSL_CTX_use_PrivateKey_file(ctx, key_file, file_type);
      if(cert_use_result != 1) {
        failf(data, "unable to set private key file: '%s' type %s",
              key_file?key_file:"(memory blob)", key_type?key_type:"PEM");
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#ifdef USE_OPENSSL_ENGINE
      {                         /* XXXX still needs some work */
        EVP_PKEY *priv_key = NULL;

        /* Implicitly use pkcs11 engine if none was provided and the
         * key_file is a PKCS#11 URI */
        if(!data->state.engine) {
          if(is_pkcs11_uri(key_file)) {
            if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
              return 0;
            }
          }
        }

        if(data->state.engine) {
          UI_METHOD *ui_method =
            UI_create_method((char *)"curl user interface");
          if(!ui_method) {
            failf(data, "unable do create " OSSL_PACKAGE
                  " user-interface method");
            return 0;
          }
          UI_method_set_opener(ui_method, UI_method_get_opener(UI_OpenSSL()));
          UI_method_set_closer(ui_method, UI_method_get_closer(UI_OpenSSL()));
          UI_method_set_reader(ui_method, ssl_ui_reader);
          UI_method_set_writer(ui_method, ssl_ui_writer);
          /* the typecast below was added to please mingw32 */
          priv_key = (EVP_PKEY *)
            ENGINE_load_private_key(data->state.engine, key_file,
                                    ui_method,
                                    key_passwd);
          UI_destroy_method(ui_method);
          if(!priv_key) {
            failf(data, "failed to load private key from crypto engine");
            return 0;
          }
          if(SSL_CTX_use_PrivateKey(ctx, priv_key) != 1) {
            failf(data, "unable to set private key");
            EVP_PKEY_free(priv_key);
            return 0;
          }
          EVP_PKEY_free(priv_key);  /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load private key");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for private key not supported");
      return 0;
#endif
    case SSL_FILETYPE_PKCS12:
      if(!cert_done) {
        failf(data, "file type P12 for private key not supported");
        return 0;
      }
      break;
    default:
      failf(data, "not supported file type for private key");
      return 0;
    }

    ssl = SSL_new(ctx);
    if(!ssl) {
      failf(data, "unable to create an SSL structure");
      return 0;
    }

    x509 = SSL_get_certificate(ssl);

    /* This version was provided by Evan Jordan and is supposed to not
       leak memory as the previous version: */
    if(x509) {
      EVP_PKEY *pktmp = X509_get_pubkey(x509);
      EVP_PKEY_copy_parameters(pktmp, SSL_get_privatekey(ssl));
      EVP_PKEY_free(pktmp);
    }

#if !defined(OPENSSL_NO_RSA) && !defined(OPENSSL_IS_BORINGSSL) && \
    !defined(OPENSSL_NO_DEPRECATED_3_0)
    {
      /* If RSA is used, don't check the private key if its flags indicate
       * it doesn't support it. */
      EVP_PKEY *priv_key = SSL_get_privatekey(ssl);
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(priv_key);
#else
      pktype = priv_key->type;
#endif
      if(pktype == EVP_PKEY_RSA) {
        RSA *rsa = EVP_PKEY_get1_RSA(priv_key);
        if(RSA_flags(rsa) & RSA_METHOD_FLAG_NO_CHECK)
          check_privkey = FALSE;
        RSA_free(rsa); /* Decrement reference count */
      }
    }
#endif

    SSL_free(ssl);

    /* If we are using DSA, we can copy the parameters from
     * the private key */

    if(check_privkey == TRUE) {
      /* Now we know that a key and cert have been set against
       * the SSL context */
      if(!SSL_CTX_check_private_key(ctx)) {
        failf(data, "Private key does not match the certificate public key");
        return 0;
      }
    }
  }
  return 1;
}